

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Dropout_x86_fma::forward_inplace(Dropout_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  long lVar11;
  uint uVar12;
  void *pvVar13;
  ulong uVar14;
  float *pfVar15;
  uint uVar16;
  int iVar17;
  float fVar19;
  float fVar21;
  float fVar22;
  undefined1 auVar20 [16];
  float fVar23;
  ulong uVar18;
  
  fVar19 = (this->super_Dropout).scale;
  if (fVar19 != 1.0) {
    iVar17 = bottom_top_blob->dims;
    auVar20 = ZEXT416((uint)fVar19);
    if (bottom_top_blob->elempack == 4) {
      uVar12 = bottom_top_blob->w;
      uVar2 = bottom_top_blob->h;
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      fVar19 = auVar20._0_4_;
      fVar21 = auVar20._4_4_;
      fVar22 = auVar20._8_4_;
      fVar23 = auVar20._12_4_;
      if (iVar17 == 3) {
        uVar16 = bottom_top_blob->c;
        if (0 < (int)uVar16) {
          uVar14 = 0;
          do {
            if (0 < (int)(uVar2 * uVar12)) {
              pfVar15 = (float *)(bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar17 = uVar2 * uVar12;
              do {
                *pfVar15 = fVar19 * *pfVar15;
                pfVar15[1] = fVar21 * pfVar15[1];
                pfVar15[2] = fVar22 * pfVar15[2];
                pfVar15[3] = fVar23 * pfVar15[3];
                pfVar15 = pfVar15 + 4;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
      }
      else if (iVar17 == 2) {
        if (0 < (int)uVar2) {
          uVar14 = 0;
          do {
            if (0 < (int)uVar12) {
              pfVar15 = (float *)((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar18 = (ulong)uVar12;
              do {
                *pfVar15 = fVar19 * *pfVar15;
                pfVar15[1] = fVar21 * pfVar15[1];
                pfVar15[2] = fVar22 * pfVar15[2];
                pfVar15[3] = fVar23 * pfVar15[3];
                pfVar15 = pfVar15 + 4;
                uVar16 = (int)uVar18 - 1;
                uVar18 = (ulong)uVar16;
              } while (uVar16 != 0);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar2);
        }
      }
      else if ((iVar17 == 1) && (0 < (int)uVar12)) {
        lVar11 = 0;
        do {
          pfVar15 = (float *)((long)bottom_top_blob->data + lVar11);
          fVar5 = pfVar15[1];
          fVar6 = pfVar15[2];
          fVar7 = pfVar15[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar11);
          *pfVar1 = fVar19 * *pfVar15;
          pfVar1[1] = fVar21 * fVar5;
          pfVar1[2] = fVar22 * fVar6;
          pfVar1[3] = fVar23 * fVar7;
          lVar11 = lVar11 + 0x10;
        } while ((ulong)uVar12 << 4 != lVar11);
      }
    }
    else {
      if (bottom_top_blob->elempack != 8) {
        if (((this->super_Dropout).scale != 1.0) && (iVar17 = bottom_top_blob->c, 0 < (long)iVar17))
        {
          uVar12 = bottom_top_blob->h * bottom_top_blob->w;
          pvVar13 = bottom_top_blob->data;
          sVar3 = bottom_top_blob->cstep;
          sVar4 = bottom_top_blob->elemsize;
          lVar11 = 0;
          do {
            if (0 < (int)uVar12) {
              uVar14 = 0;
              do {
                *(float *)((long)pvVar13 + uVar14 * 4) =
                     (this->super_Dropout).scale * *(float *)((long)pvVar13 + uVar14 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar12 != uVar14);
            }
            lVar11 = lVar11 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
          } while (lVar11 != iVar17);
        }
        return 0;
      }
      uVar12 = bottom_top_blob->w;
      uVar2 = bottom_top_blob->h;
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      fVar19 = auVar20._0_4_;
      fVar21 = auVar20._4_4_;
      fVar22 = auVar20._8_4_;
      fVar23 = auVar20._12_4_;
      if (iVar17 == 3) {
        uVar16 = bottom_top_blob->c;
        if (0 < (int)uVar16) {
          uVar14 = 0;
          do {
            if (0 < (int)(uVar2 * uVar12)) {
              pfVar15 = (float *)(bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar17 = uVar2 * uVar12;
              do {
                *pfVar15 = fVar19 * *pfVar15;
                pfVar15[1] = fVar21 * pfVar15[1];
                pfVar15[2] = fVar22 * pfVar15[2];
                pfVar15[3] = fVar23 * pfVar15[3];
                pfVar15[4] = fVar19 * pfVar15[4];
                pfVar15[5] = fVar21 * pfVar15[5];
                pfVar15[6] = fVar22 * pfVar15[6];
                pfVar15[7] = 0.0;
                pfVar15 = pfVar15 + 8;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
      }
      else if (iVar17 == 2) {
        if (0 < (int)uVar2) {
          uVar14 = 0;
          do {
            if (0 < (int)uVar12) {
              pfVar15 = (float *)((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar18 = (ulong)uVar12;
              do {
                *pfVar15 = fVar19 * *pfVar15;
                pfVar15[1] = fVar21 * pfVar15[1];
                pfVar15[2] = fVar22 * pfVar15[2];
                pfVar15[3] = fVar23 * pfVar15[3];
                pfVar15[4] = fVar19 * pfVar15[4];
                pfVar15[5] = fVar21 * pfVar15[5];
                pfVar15[6] = fVar22 * pfVar15[6];
                pfVar15[7] = 0.0;
                pfVar15 = pfVar15 + 8;
                uVar16 = (int)uVar18 - 1;
                uVar18 = (ulong)uVar16;
              } while (uVar16 != 0);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar2);
        }
      }
      else if ((iVar17 == 1) && (0 < (int)uVar12)) {
        lVar11 = 0;
        do {
          pfVar15 = (float *)((long)bottom_top_blob->data + lVar11);
          fVar5 = pfVar15[1];
          fVar6 = pfVar15[2];
          fVar7 = pfVar15[3];
          fVar8 = pfVar15[4];
          fVar9 = pfVar15[5];
          fVar10 = pfVar15[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar11);
          *pfVar1 = fVar19 * *pfVar15;
          pfVar1[1] = fVar21 * fVar5;
          pfVar1[2] = fVar22 * fVar6;
          pfVar1[3] = fVar23 * fVar7;
          pfVar1[4] = fVar19 * fVar8;
          pfVar1[5] = fVar21 * fVar9;
          pfVar1[6] = fVar22 * fVar10;
          pfVar1[7] = 0.0;
          lVar11 = lVar11 + 0x20;
        } while ((ulong)uVar12 << 5 != lVar11);
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}